

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUtility.cpp
# Opt level: O0

bool GmmIsYUVFormatLCUAligned(GMM_RESOURCE_FORMAT Format)

{
  bool local_d;
  bool Status;
  GMM_RESOURCE_FORMAT Format_local;
  
  if (((((Format == GMM_FORMAT_YCRCB_NORMAL) || (Format == GMM_FORMAT_AYUV)) ||
       (Format == GMM_FORMAT_NV12)) || ((Format == GMM_FORMAT_P010 || (Format == GMM_FORMAT_P016))))
     || ((Format == GMM_FORMAT_Y210 ||
         ((Format == GMM_FORMAT_Y410 || (Format == GMM_FORMAT_Y216 || Format == GMM_FORMAT_Y416)))))
     ) {
    local_d = true;
  }
  else {
    local_d = false;
  }
  return local_d;
}

Assistant:

bool GMM_STDCALL GmmIsYUVFormatLCUAligned(GMM_RESOURCE_FORMAT Format)
{
    bool Status = 0;

    switch(Format)
    {
        case GMM_FORMAT_NV12:
        case GMM_FORMAT_P010:
        case GMM_FORMAT_P016:
        case GMM_FORMAT_YUY2:
        case GMM_FORMAT_Y210:
        case GMM_FORMAT_Y410:
        case GMM_FORMAT_Y216:
        case GMM_FORMAT_Y416:
        case GMM_FORMAT_AYUV:
            Status = true;
            break;
        default:
            Status = false;
            break;
    }
    return Status;
}